

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void __thiscall deqp::gls::ContextArray::glBind(ContextArray *this,deUint32 loc)

{
  Context *pCVar1;
  deUint32 dVar2;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  
  if (this->m_storage == STORAGE_USER) {
    (*this->m_ctx->_vptr_Context[0x25])
              (this->m_ctx,(ulong)targetToGL::targets[(int)this->m_target],0);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x253);
    uVar3 = (ulong)(int)this->m_inputType;
    if ((uVar3 < 10) && ((0x207U >> (this->m_inputType & 0x1f) & 1) != 0)) {
      (*this->m_ctx->_vptr_Context[0x4e])
                (this->m_ctx,loc,(ulong)(uint)this->m_componentCount,
                 (ulong)inputTypeToGL::types[uVar3],(ulong)this->m_normalize,
                 (ulong)(uint)this->m_stride,this->m_data + this->m_offset);
      dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
      pcVar5 = "glVertexAttribPointer()";
      iVar4 = 0x26e;
    }
    else {
      pCVar1 = this->m_ctx;
      if (this->m_outputType < OUTPUTTYPE_INT) {
        (*pCVar1->_vptr_Context[0x4e])
                  (pCVar1,loc,(ulong)(uint)this->m_componentCount,(ulong)inputTypeToGL::types[uVar3]
                   ,(ulong)this->m_normalize,(ulong)(uint)this->m_stride,
                   this->m_data + this->m_offset);
        dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
        pcVar5 = "glVertexAttribPointer()";
        iVar4 = 0x25d;
      }
      else {
        (*pCVar1->_vptr_Context[0x4f])
                  (pCVar1,loc,(ulong)(uint)this->m_componentCount,(ulong)inputTypeToGL::types[uVar3]
                   ,(ulong)(uint)this->m_stride,this->m_data + this->m_offset);
        dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
        pcVar5 = "glVertexAttribIPointer()";
        iVar4 = 0x263;
      }
    }
    glu::checkError(dVar2,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,iVar4);
    return;
  }
  if (this->m_storage == STORAGE_BUFFER) {
    (*this->m_ctx->_vptr_Context[0x25])
              (this->m_ctx,(ulong)targetToGL::targets[(int)this->m_target],(ulong)this->m_glBuffer);
    dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(dVar2,"glBindBuffer()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,0x230);
    uVar3 = (ulong)(int)this->m_inputType;
    if ((uVar3 < 10) && ((0x207U >> (this->m_inputType & 0x1f) & 1) != 0)) {
      (*this->m_ctx->_vptr_Context[0x4e])
                (this->m_ctx,loc,(ulong)(uint)this->m_componentCount,
                 (ulong)inputTypeToGL::types[uVar3],(ulong)this->m_normalize,
                 (ulong)(uint)this->m_stride,(long)this->m_offset);
      dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
      pcVar5 = "glVertexAttribPointer()";
      iVar4 = 0x24b;
    }
    else {
      pCVar1 = this->m_ctx;
      if (this->m_outputType < OUTPUTTYPE_INT) {
        (*pCVar1->_vptr_Context[0x4e])
                  (pCVar1,loc,(ulong)(uint)this->m_componentCount,(ulong)inputTypeToGL::types[uVar3]
                   ,(ulong)this->m_normalize,(ulong)(uint)this->m_stride,(long)this->m_offset);
        dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
        pcVar5 = "glVertexAttribPointer()";
        iVar4 = 0x23a;
      }
      else {
        (*pCVar1->_vptr_Context[0x4f])
                  (pCVar1,loc,(ulong)(uint)this->m_componentCount,(ulong)inputTypeToGL::types[uVar3]
                   ,(ulong)(uint)this->m_stride,(long)this->m_offset);
        dVar2 = (*this->m_ctx->_vptr_Context[0x79])();
        pcVar5 = "glVertexAttribIPointer()";
        iVar4 = 0x240;
      }
    }
    glu::checkError(dVar2,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsVertexArrayTests.cpp"
                    ,iVar4);
    (*this->m_ctx->_vptr_Context[0x25])
              (this->m_ctx,(ulong)targetToGL::targets[(int)this->m_target],0);
    return;
  }
  return;
}

Assistant:

void ContextArray::glBind (deUint32 loc)
{
	if (m_storage == STORAGE_BUFFER)
	{
		m_ctx.bindBuffer(targetToGL(m_target), m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		if (!inputTypeIsFloatType(m_inputType))
		{
			// Input is not float type

			if (outputTypeIsFloatType(m_outputType))
			{
				// Output type is float type
				m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, (GLvoid*)((GLintptr)m_offset));
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
			}
			else
			{
				// Output type is int type
				m_ctx.vertexAttribIPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_stride, (GLvoid*)((GLintptr)m_offset));
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribIPointer()");
			}
		}
		else
		{
			// Input type is float type

			// Output type must be float type
			DE_ASSERT(m_outputType == OUTPUTTYPE_FLOAT || m_outputType == OUTPUTTYPE_VEC2 || m_outputType == OUTPUTTYPE_VEC3 || m_outputType == OUTPUTTYPE_VEC4);

			m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, (GLvoid*)((GLintptr)m_offset));
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
		}

		m_ctx.bindBuffer(targetToGL(m_target), 0);
	}
	else if (m_storage == STORAGE_USER)
	{
		m_ctx.bindBuffer(targetToGL(m_target), 0);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glBindBuffer()");

		if (!inputTypeIsFloatType(m_inputType))
		{
			// Input is not float type

			if (outputTypeIsFloatType(m_outputType))
			{
				// Output type is float type
				m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, m_data + m_offset);
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
			}
			else
			{
				// Output type is int type
				m_ctx.vertexAttribIPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_stride, m_data + m_offset);
				GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribIPointer()");
			}
		}
		else
		{
			// Input type is float type

			// Output type must be float type
			DE_ASSERT(m_outputType == OUTPUTTYPE_FLOAT || m_outputType == OUTPUTTYPE_VEC2 || m_outputType == OUTPUTTYPE_VEC3 || m_outputType == OUTPUTTYPE_VEC4);

			m_ctx.vertexAttribPointer(loc, m_componentCount, inputTypeToGL(m_inputType), m_normalize, m_stride, m_data + m_offset);
			GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glVertexAttribPointer()");
		}
	}
	else
		DE_ASSERT(false);
}